

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O2

bool hands_full(CHAR_DATA *ch)

{
  OBJ_DATA *pOVar1;
  OBJ_DATA *pOVar2;
  OBJ_DATA *pOVar3;
  OBJ_DATA *pOVar4;
  OBJ_DATA *pOVar5;
  int iVar6;
  uint uVar7;
  string_view fmt;
  int local_1c;
  
  pOVar1 = get_eq_char(ch,0);
  if (pOVar1 != (OBJ_DATA *)0x0) {
    local_1c = 1;
  }
  pOVar2 = get_eq_char(ch,0x10);
  pOVar3 = get_eq_char(ch,0x11);
  pOVar4 = get_eq_char(ch,0xb);
  pOVar5 = get_eq_char(ch,0x12);
  iVar6 = (((((uint)(pOVar1 != (OBJ_DATA *)0x0) - (uint)(pOVar2 == (OBJ_DATA *)0x0)) -
            (uint)(pOVar3 == (OBJ_DATA *)0x0)) - (uint)(pOVar4 == (OBJ_DATA *)0x0)) + 4) -
          (uint)(pOVar5 == (OBJ_DATA *)0x0);
  pOVar1 = get_eq_char(ch,0x10);
  if (((pOVar1 != (OBJ_DATA *)0x0) && ((uint)pOVar1->value[0] < 10)) &&
     ((0x308U >> (pOVar1->value[0] & 0x1fU) & 1) != 0)) {
    iVar6 = iVar6 + 1;
  }
  uVar7 = iVar6 - ch->arms;
  local_1c = uVar7 + 2;
  if (0 < (int)uVar7) {
    fmt._M_str = "Hands full: Character holding {} items.";
    fmt._M_len = 0x27;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,&local_1c);
  }
  return uVar7 < 0x7ffffffe;
}

Assistant:

bool hands_full(CHAR_DATA *ch)
{
	OBJ_DATA *weapon;
	int count;

	count = 0;

	if (get_eq_char(ch, WEAR_LIGHT) != nullptr)
		count++;

	if (get_eq_char(ch, WEAR_WIELD) != nullptr)
		count++;

	if (get_eq_char(ch, WEAR_HOLD) != nullptr)
		count++;

	if (get_eq_char(ch, WEAR_SHIELD) != nullptr)
		count++;

	if (get_eq_char(ch, WEAR_DUAL_WIELD) != nullptr)
		count++;

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon != nullptr
		&& (weapon->value[0] == WEAPON_STAFF || weapon->value[0] == WEAPON_POLEARM || weapon->value[0] == WEAPON_SPEAR))
	{
		count++;
	}

	count -= ch->arms - 2;

	if (count < 2)
		return false;

	if (count > 2)
		RS.Logger.Warn("Hands full: Character holding {} items.", count);

	return true;
}